

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O0

bool __thiscall
duckdb::Linenoise::AddCompletionMarker
          (Linenoise *this,char *buf,idx_t len,string *result_buffer,
          vector<duckdb::highlightToken,_true> *tokens)

{
  bool bVar1;
  reference pvVar2;
  pointer phVar3;
  char *pcVar4;
  reference pvVar5;
  string *in_RCX;
  pointer in_RDX;
  vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *in_RSI;
  vector<duckdb::highlightToken,_true> *in_RDI;
  highlightToken completion_token;
  idx_t cpos;
  idx_t i_1;
  TabCompletion completion;
  idx_t i;
  size_type in_stack_fffffffffffffed8;
  vector<duckdb::Completion,_true> *in_stack_fffffffffffffee0;
  string *this_00;
  vector<duckdb::Completion,_std::allocator<duckdb::Completion>_> *in_stack_fffffffffffffef0;
  highlightToken local_d8;
  string local_c0 [24];
  Linenoise *in_stack_ffffffffffffff58;
  allocator local_99;
  string local_98 [32];
  undefined1 *local_78;
  pointer local_70;
  undefined4 local_54;
  pointer local_38;
  string *local_28;
  pointer local_20;
  vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *local_18;
  byte local_1;
  
  if ((enableCompletionRendering & 1) == 0) {
    local_1 = 0;
  }
  else if (((ulong)in_RDI[4].
                   super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
                   super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                   ._M_impl.super__Vector_impl_data._M_start & 0x100) == 0) {
    local_1 = 0;
  }
  else if (in_RDX < (pointer)0x3e8) {
    if ((((ulong)in_RDI[4].
                 super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
                 super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                 ._M_impl.super__Vector_impl_data._M_start & 0x10000000000) == 0) ||
       (in_RDI[1].super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
        super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != in_RDX)) {
      local_1 = 0;
    }
    else if (in_RDI[1].super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
             .super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage < (pointer)0x3) {
      local_1 = 0;
    }
    else {
      local_28 = in_RCX;
      local_20 = in_RDX;
      local_18 = in_RSI;
      bVar1 = ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::empty
                        ((vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
                         in_stack_fffffffffffffef0);
      if ((bVar1) ||
         (pvVar2 = vector<duckdb::highlightToken,_true>::back(in_RDI), pvVar2->type != TOKEN_ERROR))
      {
        for (local_38 = (pointer)&in_RDI[1].
                                  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                  .
                                  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].field_0x15;
            local_38 <
            in_RDI[1].super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_38 = (pointer)&local_38->field_0x1) {
          bVar1 = IsCompletionCharacter
                            ((&local_38->type)
                             [(long)&local_18->
                                     super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                             ]);
          if (!bVar1) {
            local_1 = 0;
            goto LAB_00204646;
          }
        }
        TabComplete(in_stack_ffffffffffffff58);
        bVar1 = ::std::vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>::empty
                          (in_stack_fffffffffffffef0);
        if (bVar1) {
          local_1 = 0;
        }
        else {
          vector<duckdb::Completion,_true>::operator[]
                    (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          phVar3 = (pointer)::std::__cxx11::string::size();
          if (local_20 < phVar3) {
            for (local_70 = in_RDI[1].
                            super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                            .
                            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_70 != (pointer)0x0; local_70 = (pointer)&local_70[-1].field_0x17) {
              local_78 = &local_70[-1].field_0x17;
              bVar1 = IsCompletionCharacter
                                (local_78[(long)&local_18->
                                                 super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                         ]);
              if (!bVar1) break;
              pvVar5 = vector<duckdb::Completion,_true>::operator[]
                                 (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
              pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)pvVar5);
              if (*pcVar4 !=
                  local_78[(long)&local_18->
                                  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                          ]) {
                local_1 = 0;
                goto LAB_00204628;
              }
            }
            phVar3 = local_20;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_98,(char *)local_18,(ulong)phVar3,&local_99);
            this_00 = local_98;
            ::std::__cxx11::string::operator=(local_28,this_00);
            ::std::__cxx11::string::~string(this_00);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_99);
            pvVar5 = vector<duckdb::Completion,_true>::operator[]
                               ((vector<duckdb::Completion,_true> *)this_00,
                                in_stack_fffffffffffffed8);
            ::std::__cxx11::string::substr((ulong)local_c0,(ulong)pvVar5);
            ::std::__cxx11::string::operator+=(local_28,local_c0);
            ::std::__cxx11::string::~string(local_c0);
            highlightToken::highlightToken(&local_d8);
            local_d8.start = (size_t)local_20;
            local_d8.type = TOKEN_COMMENT;
            local_d8.search_match = true;
            ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::
            push_back(local_18,(value_type *)pvVar5);
            local_1 = 1;
          }
          else {
            local_1 = 0;
          }
        }
LAB_00204628:
        local_54 = 1;
        TabCompletion::~TabCompletion((TabCompletion *)0x204635);
      }
      else {
        local_1 = 0;
      }
    }
  }
  else {
    local_1 = 0;
  }
LAB_00204646:
  return (bool)(local_1 & 1);
}

Assistant:

bool Linenoise::AddCompletionMarker(const char *buf, idx_t len, string &result_buffer,
                                    vector<highlightToken> &tokens) const {
	if (!enableCompletionRendering) {
		return false;
	}
	if (!continuation_markers) {
		// don't render when pressing ctrl+c, only when editing
		return false;
	}
	static constexpr const idx_t MAX_COMPLETION_LENGTH = 1000;
	if (len >= MAX_COMPLETION_LENGTH) {
		return false;
	}
	if (!insert || pos != len) {
		// only show when inserting a character at the end
		return false;
	}
	if (pos < 3) {
		// we need at least 3 bytes
		return false;
	}
	if (!tokens.empty() && tokens.back().type == tokenType::TOKEN_ERROR) {
		// don't show auto-completion when we have errors
		return false;
	}
	// we ONLY show completion if we have typed at least three characters that are supported for completion
	// for now this is ONLY the characters a-z, A-Z and underscore (_)
	for (idx_t i = pos - 3; i < pos; i++) {
		if (!IsCompletionCharacter(buf[i])) {
			return false;
		}
	}
	auto completion = TabComplete();
	if (completion.completions.empty()) {
		// no completions found
		return false;
	}
	if (completion.completions[0].completion.size() <= len) {
		// completion is not long enough
		return false;
	}
	// we have stricter requirements for rendering completions - the completion must match exactly
	for (idx_t i = pos; i > 0; i--) {
		auto cpos = i - 1;
		if (!IsCompletionCharacter(buf[cpos])) {
			break;
		}
		if (completion.completions[0].completion[cpos] != buf[cpos]) {
			return false;
		}
	}
	// add the first completion found for rendering purposes
	result_buffer = string(buf, len);
	result_buffer += completion.completions[0].completion.substr(len);

	highlightToken completion_token;
	completion_token.start = len;
	completion_token.type = tokenType::TOKEN_COMMENT;
	completion_token.search_match = true;
	tokens.push_back(completion_token);
	return true;
}